

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SAXParser::setExternalNoNamespaceSchemaLocation
          (SAXParser *this,XMLCh *noNamespaceSchemaLocation)

{
  XMLCh *noNamespaceSchemaLocation_local;
  SAXParser *this_local;
  
  XMLScanner::setExternalNoNamespaceSchemaLocation(this->fScanner,noNamespaceSchemaLocation);
  return;
}

Assistant:

void SAXParser::setExternalNoNamespaceSchemaLocation(const XMLCh* const noNamespaceSchemaLocation)
{
    fScanner->setExternalNoNamespaceSchemaLocation(noNamespaceSchemaLocation);
}